

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_test_spurious_unsub_does_not_affect_subscriptions_Test::TestBody
          (SubjectSetRegisterTest_test_spurious_unsub_does_not_affect_subscriptions_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_398;
  AssertHelper local_378;
  Message local_370;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> local_368;
  bool local_2f1;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_2c0;
  Message local_2b8;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> local_2b0;
  bool local_239;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_208;
  Message local_200;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> local_1f8;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__1;
  string local_168;
  AssertHelper local_148;
  Message local_140;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> local_138;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_;
  SubjectSetRegister local_a0 [8];
  SubjectSetRegister subject_register;
  SubjectSetRegisterTest_test_spurious_unsub_does_not_affect_subscriptions_Test *this_local;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(local_a0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_a0);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  local_c1 = std::optional::operator_cast_to_bool((optional *)&local_138);
  local_c1 = !local_c1;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_c1,(type *)0x0)
  ;
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional(&local_138);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_168,(internal *)local_c0,
               (AssertionResult *)"subject_register.NextSubscriptionSync()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x33a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    testing::Message::~Message(&local_140);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_a0);
    bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
    local_181 = std::optional::operator_cast_to_bool((optional *)&local_1f8);
    local_181 = !local_181;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_180,&local_181,(type *)0x0);
    std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional(&local_1f8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
    if (!bVar1) {
      testing::Message::Message(&local_200);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_180,
                 (AssertionResult *)"subject_register.NextSubscriptionSync()","true","false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_208,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
                 ,0x33d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_208,&local_200);
      testing::internal::AssertHelper::~AssertHelper(&local_208);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_200);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_a0);
      bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
      local_239 = std::optional::operator_cast_to_bool((optional *)&local_2b0);
      local_239 = !local_239;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_238,&local_239,(type *)0x0);
      std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional(&local_2b0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
      if (!bVar1) {
        testing::Message::Message(&local_2b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_238,
                   (AssertionResult *)"subject_register.NextSubscriptionSync()","true","false",in_R9
                  );
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_2c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
                   ,0x340,pcVar2);
        testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
        testing::internal::AssertHelper::~AssertHelper(&local_2c0);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_2b8);
      }
      gtest_ar__1.message_.ptr_._5_3_ = 0;
      gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
      if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
        bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_a0);
        bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
        local_2f1 = std::optional::operator_cast_to_bool((optional *)&local_368);
        local_2f1 = !local_2f1;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_2f0,&local_2f1,(type *)0x0);
        std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional(&local_368);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
        if (!bVar1) {
          testing::Message::Message(&local_370);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_398,(internal *)local_2f0,
                     (AssertionResult *)"subject_register.NextSubscriptionSync()","true","false",
                     in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_378,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
                     ,0x343,pcVar2);
          testing::internal::AssertHelper::operator=(&local_378,&local_370);
          testing::internal::AssertHelper::~AssertHelper(&local_378);
          std::__cxx11::string::~string((string *)&local_398);
          testing::Message::~Message(&local_370);
        }
        gtest_ar__1.message_.ptr_._5_3_ = 0;
        gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
        if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
          gtest_ar__1.message_.ptr_._4_4_ = 0;
        }
      }
    }
  }
  SubjectSetRegister::~SubjectSetRegister(local_a0);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_spurious_unsub_does_not_affect_subscriptions)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Unregister(SS_SUBJECT0);
    ASSERT_FALSE(subject_register.NextSubscriptionSync());

    subject_register.Unregister(SS_SUBJECT0);
    ASSERT_FALSE(subject_register.NextSubscriptionSync());

    subject_register.Unregister(SS_SUBJECT0);
    ASSERT_FALSE(subject_register.NextSubscriptionSync());

    subject_register.Unregister(SS_SUBJECT1);
    ASSERT_FALSE(subject_register.NextSubscriptionSync());
}